

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseBase.h
# Opt level: O0

void __thiscall
Eigen::
DenseBase<Eigen::Block<Eigen::Transpose<Eigen::Map<Eigen::Matrix<float,_1,_-1,_1,_1,_8>,_0,_Eigen::Stride<0,_0>_>_>,_-1,_1,_true>_>
::DenseBase(DenseBase<Eigen::Block<Eigen::Transpose<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_8>,_0,_Eigen::Stride<0,_0>_>_>,__1,_1,_true>_>
            *this)

{
  DenseBase<Eigen::Block<Eigen::Transpose<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_8>,_0,_Eigen::Stride<0,_0>_>_>,__1,_1,_true>_>
  *this_local;
  
  return;
}

Assistant:

EIGEN_DEVICE_FUNC DenseBase()
    {
      /* Just checks for self-consistency of the flags.
       * Only do it when debugging Eigen, as this borders on paranoia and could slow compilation down
       */
#ifdef EIGEN_INTERNAL_DEBUGGING
      EIGEN_STATIC_ASSERT((EIGEN_IMPLIES(MaxRowsAtCompileTime==1 && MaxColsAtCompileTime!=1, int(IsRowMajor))
                        && EIGEN_IMPLIES(MaxColsAtCompileTime==1 && MaxRowsAtCompileTime!=1, int(!IsRowMajor))),
                          INVALID_STORAGE_ORDER_FOR_THIS_VECTOR_EXPRESSION)
#endif
    }